

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_profile_check_key(mbedtls_x509_crt_profile *profile,mbedtls_pk_context_conflict *pk)

{
  mbedtls_pk_type_t mVar1;
  int iVar2;
  mbedtls_pk_context_conflict local_48;
  
  mVar1 = mbedtls_pk_get_type(pk);
  iVar2 = -1;
  if (mVar1 - MBEDTLS_PK_ECKEY < 3) {
    local_48.priv_id = pk->priv_id;
    local_48._20_4_ = *(undefined4 *)&pk->field_0x14;
    local_48.pk_info = pk->pk_info;
    local_48.pk_ctx = pk->pk_ctx;
    mbedtls_pk_get_type(&local_48);
    if (*local_48.pk_ctx != 0) {
      iVar2 = ((profile->allowed_curves >> ((byte)((char)*local_48.pk_ctx - 1) & 0x1f) & 1) != 0) -
              1;
    }
  }
  return iVar2;
}

Assistant:

static int x509_profile_check_key(const mbedtls_x509_crt_profile *profile,
                                  const mbedtls_pk_context *pk)
{
    const mbedtls_pk_type_t pk_alg = mbedtls_pk_get_type(pk);

#if defined(MBEDTLS_RSA_C)
    if (pk_alg == MBEDTLS_PK_RSA || pk_alg == MBEDTLS_PK_RSASSA_PSS) {
        if (mbedtls_pk_get_bitlen(pk) >= profile->rsa_min_bitlen) {
            return 0;
        }

        return -1;
    }
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (pk_alg == MBEDTLS_PK_ECDSA ||
        pk_alg == MBEDTLS_PK_ECKEY ||
        pk_alg == MBEDTLS_PK_ECKEY_DH) {
        const mbedtls_ecp_group_id gid = mbedtls_pk_get_group_id(pk);

        if (gid == MBEDTLS_ECP_DP_NONE) {
            return -1;
        }

        if ((profile->allowed_curves & MBEDTLS_X509_ID_FLAG(gid)) != 0) {
            return 0;
        }

        return -1;
    }
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */

    return -1;
}